

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

int __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::GetSideOrient
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this,int side)

{
  int in_ESI;
  TPZCompElHDiv<pzshape::TPZShapeLinear> *in_RDI;
  int firstside;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if ((in_ESI < 0) || (3 < in_ESI)) {
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  if (in_ESI < 2) {
    local_4 = TPZCompElHDiv<pzshape::TPZShapeLinear>::GetSideOrient
                        (in_RDI,in_stack_ffffffffffffffdc);
  }
  else if (in_ESI == 2) {
    local_4 = (int)in_RDI[1].super_TPZIntelGen<pzshape::TPZShapeLinear>.super_TPZInterpolatedElement
                   .super_TPZInterpolationSpace.super_TPZCompEl.fIndex;
  }
  else {
    local_4 = *(int *)((long)&in_RDI[1].super_TPZIntelGen<pzshape::TPZShapeLinear>.
                              super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                              super_TPZCompEl.fIndex + 4);
  }
  return local_4;
}

Assistant:

int TPZCompElHDivCollapsed<TSHAPE>::GetSideOrient(int side)
{
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    if (side < firstside || side >= TSHAPE::NSides + 1) {
        DebugStop();
    }

    if (side < TSHAPE::NSides - 1) {
        return TPZCompElHDiv<TSHAPE>::GetSideOrient(side);
    }
    else if(side == TSHAPE::NSides-1) return fbottom_side_orient;
    else return ftop_side_orient;
}